

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

Location * __thiscall
trieste::REIterator::current(Location *__return_storage_ptr__,REIterator *this)

{
  const_pointer pcVar1;
  pointer pcVar2;
  __shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  CLI::std::__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,(__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> *)this);
  pcVar1 = (this->sp).data_;
  pcVar2 = (((this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->contents)._M_dataplus._M_p;
  CLI::std::__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             &_Stack_28);
  __return_storage_ptr__->pos = (long)pcVar1 - (long)pcVar2;
  __return_storage_ptr__->len = 1;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Location current() const
    {
      return {
        source, static_cast<size_t>(sp.data() - source->view().data()), 1};
    }